

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::SimpleAtob(lts_20250127 *this,string_view str,Nonnull<bool_*> out)

{
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view piece1_04;
  string_view piece1_05;
  string_view piece1_06;
  string_view piece1_07;
  string_view piece1_08;
  bool bVar1;
  string_view local_170;
  Nonnull<bool_*> local_160;
  char *local_158;
  string_view local_150;
  Nonnull<bool_*> local_140;
  char *local_138;
  string_view local_130;
  Nonnull<bool_*> local_120;
  char *local_118;
  string_view local_110;
  Nonnull<bool_*> local_100;
  char *local_f8;
  string_view local_f0;
  Nonnull<bool_*> local_e0;
  char *local_d8;
  string_view local_d0;
  Nonnull<bool_*> local_c0;
  char *local_b8;
  string_view local_b0;
  Nonnull<bool_*> local_a0;
  char *local_98;
  string_view local_90;
  Nonnull<bool_*> local_80;
  char *local_78;
  string_view local_70;
  Nonnull<bool_*> local_60;
  char *local_58;
  string_view local_50;
  lts_20250127 *local_40;
  char *local_38;
  char *local_30;
  char *absl_raw_log_internal_basename;
  Nonnull<bool_*> out_local;
  string_view str_local;
  
  absl_raw_log_internal_basename = str._M_str;
  local_38 = (char *)str._M_len;
  out_local = (Nonnull<bool_*>)this;
  str_local._M_len = (size_t)local_38;
  if (absl_raw_log_internal_basename == (char *)0x0) {
    local_30 = "numbers.cc";
    raw_log_internal::RawLog
              (kFatal,"numbers.cc",0x71,"Check %s failed: %s","out != nullptr",
               "Output pointer must not be nullptr.");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x71,"bool absl::SimpleAtob(absl::string_view, absl::Nonnull<bool *>)");
  }
  local_40 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"true");
  piece1_08._M_str = local_38;
  piece1_08._M_len = (size_t)local_40;
  bVar1 = EqualsIgnoreCase(piece1_08,local_50);
  if (!bVar1) {
    local_60 = out_local;
    local_58 = (char *)str_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"t");
    piece1_07._M_str = local_58;
    piece1_07._M_len = (size_t)local_60;
    bVar1 = EqualsIgnoreCase(piece1_07,local_70);
    if (!bVar1) {
      local_80 = out_local;
      local_78 = (char *)str_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"yes");
      piece1_06._M_str = local_78;
      piece1_06._M_len = (size_t)local_80;
      bVar1 = EqualsIgnoreCase(piece1_06,local_90);
      if (!bVar1) {
        local_a0 = out_local;
        local_98 = (char *)str_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"y");
        piece1_05._M_str = local_98;
        piece1_05._M_len = (size_t)local_a0;
        bVar1 = EqualsIgnoreCase(piece1_05,local_b0);
        if (!bVar1) {
          local_c0 = out_local;
          local_b8 = (char *)str_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"1");
          piece1_04._M_str = local_b8;
          piece1_04._M_len = (size_t)local_c0;
          bVar1 = EqualsIgnoreCase(piece1_04,local_d0);
          if (!bVar1) {
            local_e0 = out_local;
            local_d8 = (char *)str_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_f0,"false");
            piece1_03._M_str = local_d8;
            piece1_03._M_len = (size_t)local_e0;
            bVar1 = EqualsIgnoreCase(piece1_03,local_f0);
            if (!bVar1) {
              local_100 = out_local;
              local_f8 = (char *)str_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_110,"f");
              piece1_02._M_str = local_f8;
              piece1_02._M_len = (size_t)local_100;
              bVar1 = EqualsIgnoreCase(piece1_02,local_110);
              if (!bVar1) {
                local_120 = out_local;
                local_118 = (char *)str_local._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_130,"no");
                piece1_01._M_str = local_118;
                piece1_01._M_len = (size_t)local_120;
                bVar1 = EqualsIgnoreCase(piece1_01,local_130);
                if (!bVar1) {
                  local_140 = out_local;
                  local_138 = (char *)str_local._M_len;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_150,"n");
                  piece1_00._M_str = local_138;
                  piece1_00._M_len = (size_t)local_140;
                  bVar1 = EqualsIgnoreCase(piece1_00,local_150);
                  if (!bVar1) {
                    local_160 = out_local;
                    local_158 = (char *)str_local._M_len;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_170,"0");
                    piece1._M_str = local_158;
                    piece1._M_len = (size_t)local_160;
                    bVar1 = EqualsIgnoreCase(piece1,local_170);
                    if (!bVar1) {
                      return false;
                    }
                  }
                }
              }
            }
            *absl_raw_log_internal_basename = '\0';
            return true;
          }
        }
      }
    }
  }
  *absl_raw_log_internal_basename = '\x01';
  return true;
}

Assistant:

bool SimpleAtob(absl::string_view str, absl::Nonnull<bool*> out) {
  ABSL_RAW_CHECK(out != nullptr, "Output pointer must not be nullptr.");
  if (EqualsIgnoreCase(str, "true") || EqualsIgnoreCase(str, "t") ||
      EqualsIgnoreCase(str, "yes") || EqualsIgnoreCase(str, "y") ||
      EqualsIgnoreCase(str, "1")) {
    *out = true;
    return true;
  }
  if (EqualsIgnoreCase(str, "false") || EqualsIgnoreCase(str, "f") ||
      EqualsIgnoreCase(str, "no") || EqualsIgnoreCase(str, "n") ||
      EqualsIgnoreCase(str, "0")) {
    *out = false;
    return true;
  }
  return false;
}